

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseRestrictedAlphabet(CFIReaderImpl *this,size_t index,size_t len)

{
  DeadlyImportError *pDVar1;
  reference pvVar2;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar3;
  undefined1 local_1c8 [24];
  size_t charIndex;
  size_t i;
  string s;
  uint32_t bits;
  uint8_t mask;
  size_t bitsAvail;
  size_type bitsPerCharacter;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  unsigned_long local_128;
  size_type alphabetLength;
  char *local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  utf8 *local_108;
  undefined1 local_100 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> alphabetUTF32;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48 [8];
  string alphabet;
  size_t len_local;
  size_t index_local;
  CFIReaderImpl *this_local;
  
  alphabet.field_2._8_8_ = in_RCX.container;
  std::__cxx11::string::string(local_48);
  if (len < 0x10) {
    if (len == 0) {
      std::__cxx11::string::operator=(local_48,"0123456789-+.e ");
    }
    else {
      if (len != 1) {
        local_99 = 1;
        pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        to_string<unsigned_long>(&local_98,len);
        std::operator+(&local_78,"Invalid restricted alphabet index ",&local_98);
        DeadlyImportError::DeadlyImportError(pDVar1,&local_78);
        local_99 = 0;
        __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      std::__cxx11::string::operator=(local_48,"0123456789-:TZ ");
    }
  }
  else {
    in_RCX.container =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(index + 0x28));
    if (in_RCX.container <= (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(len - 0x10)) {
      alphabetUTF32.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_e0,len);
      std::operator+(&local_c0,"Invalid restricted alphabet index ",&local_e0);
      DeadlyImportError::DeadlyImportError(pDVar1,&local_c0);
      alphabetUTF32.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(index + 0x28),len - 0x10);
    std::__cxx11::string::operator=(local_48,(string *)pvVar2);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
  local_108 = (utf8 *)std::__cxx11::string::begin();
  local_110._M_current = (char *)std::__cxx11::string::end();
  local_118 = (char *)std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
  alphabetLength =
       (size_type)
       utf8::
       utf8to32<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                 (local_108,local_110,
                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )local_118,in_RCX);
  local_128 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
  if (1 < local_128) {
    for (bitsAvail = 1; (ulong)(1L << ((byte)bitsAvail & 0x3f)) <= local_128;
        bitsAvail = bitsAvail + 1) {
    }
    _bits = 0;
    s.field_2._M_local_buf[0xf] = (char)(1 << ((byte)bitsAvail & 0x1f)) + -1;
    s.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)&i);
    charIndex = 0;
    do {
      if ((ulong)alphabet.field_2._8_8_ <= charIndex) {
        FIStringValue::create((FIStringValue *)local_1c8,(string *)&i);
        std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FIStringValue,void>
                  ((shared_ptr<Assimp::FIValue_const> *)this,
                   (shared_ptr<Assimp::FIStringValue> *)local_1c8);
        std::shared_ptr<Assimp::FIStringValue>::~shared_ptr
                  ((shared_ptr<Assimp::FIStringValue> *)local_1c8);
        std::__cxx11::string::~string((string *)&i);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
        std::__cxx11::string::~string(local_48);
        sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = extraout_RDX._M_pi;
        sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<const_Assimp::FIValue>)
               sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
      }
      s.field_2._8_4_ = s.field_2._8_4_ << 8 | (uint)*(byte *)(*(long *)(index + 0x10) + charIndex);
      _bits = _bits + 8;
      while (bitsAvail <= _bits) {
        _bits = _bits - bitsAvail;
        local_1c8._16_8_ =
             ZEXT48((uint)s.field_2._8_4_ >> ((byte)_bits & 0x1f) &
                    (uint)(byte)s.field_2._M_local_buf[0xf]);
        if ((ulong)local_1c8._16_8_ < local_128) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                     local_1c8._16_8_);
          std::__cxx11::string::push_back((char)&i);
        }
        else if (local_1c8._16_8_ != (ulong)(byte)s.field_2._M_local_buf[0xf]) {
          pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar1,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
      }
      charIndex = charIndex + 1;
    } while( true );
  }
  pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  to_string<unsigned_long>(&local_168,local_128);
  std::operator+(&local_148,"Invalid restricted alphabet length ",&local_168);
  DeadlyImportError::DeadlyImportError(pDVar1,&local_148);
  __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

std::shared_ptr<const FIValue> parseRestrictedAlphabet(size_t index, size_t len) {
        std::string alphabet;
        if (index < 16) {
            switch (index) {
            case 0: // numeric
                alphabet = "0123456789-+.e ";
                break;
            case 1: // date and time
                alphabet = "0123456789-:TZ ";
                break;
            default:
                throw DeadlyImportError("Invalid restricted alphabet index " + to_string(index));
            }
        }
        else {
            if (index - 16 >= vocabulary.restrictedAlphabetTable.size()) {
                throw DeadlyImportError("Invalid restricted alphabet index " + to_string(index));
            }
            alphabet = vocabulary.restrictedAlphabetTable[index - 16];
        }
        std::vector<uint32_t> alphabetUTF32;
        utf8::utf8to32(alphabet.begin(), alphabet.end(), back_inserter(alphabetUTF32));
        std::string::size_type alphabetLength = alphabetUTF32.size();
        if (alphabetLength < 2) {
            throw DeadlyImportError("Invalid restricted alphabet length " + to_string(alphabetLength));
        }
        std::string::size_type bitsPerCharacter = 1;
        while ((1ull << bitsPerCharacter) <= alphabetLength) {
            ++bitsPerCharacter;
        }
        size_t bitsAvail = 0;
        uint8_t mask = (1 << bitsPerCharacter) - 1;
        uint32_t bits = 0;
        std::string s;
        for (size_t i = 0; i < len; ++i) {
            bits = (bits << 8) | dataP[i];
            bitsAvail += 8;
            while (bitsAvail >= bitsPerCharacter) {
                bitsAvail -= bitsPerCharacter;
                size_t charIndex = (bits >> bitsAvail) & mask;
                if (charIndex < alphabetLength) {
                    s.push_back(alphabetUTF32[charIndex]);
                }
                else if (charIndex != mask) {
                    throw DeadlyImportError(parseErrorMessage);
                }
            }
        }
        return FIStringValue::create(std::move(s));
    }